

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

void __thiscall QTreeViewPrivate::drawAnimatedOperation(QTreeViewPrivate *this,QPainter *painter)

{
  undefined4 uVar1;
  int iVar2;
  QPainter *this_00;
  undefined8 in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  bool collapsing;
  int current;
  int end;
  int start;
  QPixmap bottom;
  QPixmap top;
  QPixmap *in_stack_fffffffffffffef8;
  undefined8 in_stack_ffffffffffffff00;
  QPixmap *this_01;
  QPixmap *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff18;
  QPixmap *local_d8;
  undefined1 *local_98;
  int in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff78;
  undefined1 *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  QVariant local_68;
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QVariantAnimation::startValue();
  uVar1 = ::QVariant::toInt((bool *)&local_28);
  ::QVariant::~QVariant(&local_28);
  QVariantAnimation::endValue();
  ::QVariant::toInt((bool *)&local_48);
  ::QVariant::~QVariant(&local_48);
  QVariantAnimation::currentValue();
  ::QVariant::toInt((bool *)&local_68);
  ::QVariant::~QVariant(&local_68);
  iVar2 = QAbstractAnimation::direction();
  local_80 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  local_70 = &DAT_aaaaaaaaaaaaaaaa;
  if (iVar2 != 1) {
    local_d8 = (QPixmap *)(in_RDI + 0x570);
  }
  else {
    local_d8 = (QPixmap *)(in_RDI + 0x558);
  }
  QPixmap::QPixmap((QPixmap *)&local_80,local_d8);
  QPixmap::width();
  QPixmap::height();
  QPainter::drawPixmap
            ((QPainter *)CONCAT44(uVar1,in_stack_ffffffffffffff18),(int)((ulong)in_RSI >> 0x20),
             (int)in_RSI,in_stack_ffffffffffffff08,(int)((ulong)in_stack_ffffffffffffff00 >> 0x20),
             (int)in_stack_ffffffffffffff00,in_stack_ffffffffffffff70,in_stack_ffffffffffffff78);
  local_98 = &DAT_aaaaaaaaaaaaaaaa;
  if (iVar2 != 1) {
    this_00 = (QPainter *)(in_RDI + 0x558);
  }
  else {
    this_00 = (QPainter *)(in_RDI + 0x570);
  }
  this_01 = (QPixmap *)&local_98;
  QPixmap::QPixmap(this_01,(QPixmap *)this_00);
  QPainter::drawPixmap(this_00,(int)((ulong)this_01 >> 0x20),(int)this_01,in_stack_fffffffffffffef8)
  ;
  QPixmap::~QPixmap(this_01);
  QPixmap::~QPixmap((QPixmap *)&local_80);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeViewPrivate::drawAnimatedOperation(QPainter *painter) const
{
    const int start = animatedOperation.startValue().toInt(),
        end = animatedOperation.endValue().toInt(),
        current = animatedOperation.currentValue().toInt();
    bool collapsing = animatedOperation.direction() == QVariantAnimation::Backward;
    const QPixmap top = collapsing ? animatedOperation.before : animatedOperation.after;
    painter->drawPixmap(0, start, top, 0, end - current - 1, top.width(), top.height());
    const QPixmap bottom = collapsing ? animatedOperation.after : animatedOperation.before;
    painter->drawPixmap(0, current, bottom);
}